

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caseconvert.cpp
# Opt level: O2

ScalarFunction * duckdb::LowerFun::GetFunction(void)

{
  LogicalType varargs;
  ScalarFunction *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff34;
  FunctionNullHandling in_stack_ffffffffffffff40;
  bind_lambda_function_t in_stack_ffffffffffffff48;
  scalar_function_t local_b0;
  LogicalType local_90;
  LogicalType local_78;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_60;
  LogicalType local_48;
  string local_30;
  
  ::std::__cxx11::string::string((string *)&local_30,"lower",(allocator *)&stack0xffffffffffffff4f);
  LogicalType::LogicalType(&local_78,VARCHAR);
  __l._M_len = 1;
  __l._M_array = &local_78;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_60,__l,(allocator_type *)&stack0xffffffffffffff4e);
  LogicalType::LogicalType(&local_90,VARCHAR);
  local_b0.super__Function_base._M_functor._8_8_ = 0;
  local_b0.super__Function_base._M_functor._M_unused._M_object = CaseConvertFunction<false>;
  local_b0._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_b0.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_48,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_48;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_ffffffffffffff2c;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_ffffffffffffff34;
  ScalarFunction::ScalarFunction
            (in_RDI,&local_30,(vector<duckdb::LogicalType,_true> *)&local_60,&local_90,&local_b0,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             CaseConvertPropagateStats<false>,(init_local_state_t)0x0,varargs,CONSISTENT,
             in_stack_ffffffffffffff40,in_stack_ffffffffffffff48);
  LogicalType::~LogicalType(&local_48);
  ::std::_Function_base::~_Function_base(&local_b0.super__Function_base);
  LogicalType::~LogicalType(&local_90);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_60);
  LogicalType::~LogicalType(&local_78);
  ::std::__cxx11::string::~string((string *)&local_30);
  return in_RDI;
}

Assistant:

ScalarFunction LowerFun::GetFunction() {
	return ScalarFunction("lower", {LogicalType::VARCHAR}, LogicalType::VARCHAR, CaseConvertFunction<false>, nullptr,
	                      nullptr, CaseConvertPropagateStats<false>);
}